

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GLPositionCase::iterate(GLPositionCase *this)

{
  undefined8 context;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  TestLog *this_00;
  undefined4 extraout_var;
  char *pcVar4;
  ShaderProgram *this_01;
  MessageBuilder *pMVar5;
  Archive *archive;
  VertexArrayBinding *local_3e0;
  ConstPixelBufferAccess local_348;
  ConstPixelBufferAccess local_320;
  undefined1 local_2f2;
  allocator<char> local_2f1;
  undefined1 local_2f0 [6];
  bool success;
  undefined1 local_2d0 [8];
  TextureLevel reference;
  Surface pixels;
  allocator<char> local_271;
  string local_270;
  undefined1 *local_250;
  undefined1 local_248 [8];
  VertexArrayBinding bindings [1];
  MessageBuilder local_1c8;
  deUint32 local_44;
  Functions *pFStack_40;
  deUint32 programGL;
  Functions *gl;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  GLPositionCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  viewport._8_8_ = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  pcVar4 = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(pcVar4);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&gl,(RenderTarget *)CONCAT44(extraout_var,iVar2),0x100,0x100,dVar3);
  pFStack_40 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  this_01 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  local_44 = glu::ShaderProgram::getProgram(this_01);
  (*pFStack_40->useProgram)(local_44);
  setViewport(pFStack_40,(RandomViewport *)&gl);
  (*pFStack_40->patchParameteri)(0x8e72,3);
  (*pFStack_40->clearColor)(0.0,0.0,0.0,1.0);
  (*pFStack_40->clear)(0x4000);
  tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_1c8,(char (*) [33])"Note: input data for in_v_attr:\n");
  arrayStr<float,12>((string *)&bindings[0].pointer.data,(Functional *)iterate::attributes,
                     (float (*) [12])&DAT_00000004,0,dVar3);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &bindings[0].pointer.data);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&bindings[0].pointer.data);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  local_250 = local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"in_v_attr",&local_271);
  glu::va::Float((VertexArrayBinding *)local_248,&local_270,4,3,0,iterate::attributes);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  context = viewport._8_8_;
  dVar3 = local_44;
  glu::pr::Patches((PrimitiveList *)&pixels.m_pixels.m_cap,3);
  glu::draw((RenderContext *)context,dVar3,1,(VertexArrayBinding *)local_248,
            (PrimitiveList *)&pixels.m_pixels.m_cap,(DrawUtilCallback *)0x0);
  getPixels((Surface *)&reference.m_data.m_cap,(RenderContext *)viewport._8_8_,(RandomViewport *)&gl
           );
  archive = tcu::TestContext::getArchive
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f0,pcVar4,&local_2f1);
  getPNG((TextureLevel *)local_2d0,archive,(string *)local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  tcu::TextureLevel::getAccess(&local_320,(TextureLevel *)local_2d0);
  tcu::Surface::getAccess(&local_348,(Surface *)&reference.m_data.m_cap);
  bVar1 = tcu::fuzzyCompare(this_00,"ImageComparison","Image Comparison",&local_320,&local_348,0.02,
                            COMPARE_LOG_RESULT);
  local_2f2 = bVar1;
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
    this_local._4_4_ = STOP;
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_2d0);
  tcu::Surface::~Surface((Surface *)&reference.m_data.m_cap);
  local_3e0 = (VertexArrayBinding *)&bindings[0].pointer.data;
  do {
    local_3e0 = local_3e0 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_3e0);
  } while (local_3e0 != (VertexArrayBinding *)local_248);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

GLPositionCase::IterateResult GLPositionCase::iterate (void)
{
	TestLog&				log						= m_testCtx.getLog();
	const RenderContext&	renderCtx				= m_context.getRenderContext();
	const RandomViewport	viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl						= renderCtx.getFunctions();
	const deUint32			programGL				= m_program->getProgram();

	static const float attributes[3*4] =
	{
		-0.8f, -0.7f, 0.1f, 0.7f,
		-0.5f,  0.4f, 0.2f, 0.5f,
		 0.3f,  0.2f, 0.3f, 0.45f
	};

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 3);

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	log << TestLog::Message << "Note: input data for in_v_attr:\n" << arrayStr(attributes, 4) << TestLog::EndMessage;

	{
		const glu::VertexArrayBinding bindings[] = { glu::va::Float("in_v_attr", 4, 3, 0, &attributes[0]) };
		glu::draw(renderCtx, programGL, DE_LENGTH_OF_ARRAY(bindings), &bindings[0], glu::pr::Patches(3));

		{
			const tcu::Surface			pixels		= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath.c_str());
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), pixels.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

			if (!success)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}